

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

bool glcts::PipelineStatisticsQueryTestFunctional2::executeClearBufferivStencilBufferTest
               (void *pThis)

{
  deUint32 err;
  long lVar1;
  GLint clear_stencil;
  undefined1 local_14 [4];
  
  lVar1 = (**(code **)(**(long **)(*(long *)((long)pThis + 0x70) + 8) + 0x18))();
  (**(code **)(lVar1 + 0x1b0))(0x1802,0,local_14);
  err = (**(code **)(lVar1 + 0x800))();
  glu::checkError(err,"glClearBufferfv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0xa34);
  return true;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeClearBufferivStencilBufferTest(void* pThis)
{
	const glw::GLint						clear_stencil = 123;
	PipelineStatisticsQueryTestFunctional2* data_ptr	  = (PipelineStatisticsQueryTestFunctional2*)pThis;
	const glw::Functions&					gl			  = data_ptr->m_context.getRenderContext().getFunctions();

	gl.clearBufferiv(GL_STENCIL, 0, /* drawbuffer */
					 &clear_stencil);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearBufferfv() call failed.");

	return true;
}